

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O3

void __thiscall
embree::barrier_sys_regression_test::thread_alloc
          (barrier_sys_regression_test *this,barrier_sys_regression_test *This)

{
  atomic<unsigned_long> *paVar1;
  __int_type _Var2;
  long lVar3;
  
  LOCK();
  paVar1 = &this->threadID;
  _Var2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  lVar3 = 1000;
  do {
    BarrierSys::wait(&this->barrier,This);
    (this->threadResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[_Var2] = _Var2;
    BarrierSys::wait(&this->barrier,This);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  return;
}

Assistant:

static void thread_alloc(barrier_sys_regression_test* This)
    {
      size_t tid = This->threadID++;
      for (size_t j=0; j<1000; j++)
      {
        This->barrier.wait();
        This->threadResults[tid] = tid;
        This->barrier.wait();
      }
    }